

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool duckdb::StringValueResult::EmptyLine(StringValueResult *result,idx_t buffer_pos)

{
  undefined8 *puVar1;
  idx_t iVar2;
  CSVStates *pCVar3;
  idx_t iVar4;
  CSVReaderOptions *pCVar5;
  const_reference cVar6;
  idx_t iVar7;
  idx_t i;
  ulong uVar8;
  
  iVar7 = (result->iterator->pos).buffer_idx;
  iVar2 = (result->iterator->pos).buffer_pos;
  pCVar3 = (result->super_ScannerResult).states;
  iVar4 = result->buffer_size;
  (result->super_ScannerResult).last_position.buffer_pos = iVar2 + 1;
  (result->super_ScannerResult).last_position.buffer_size = iVar4;
  (result->super_ScannerResult).last_position.buffer_idx = iVar7;
  if ((pCVar3->states[1] == CARRIAGE_RETURN) &&
     ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
      new_line.value == CARRY_ON)) {
    (result->super_ScannerResult).last_position.buffer_pos = iVar2 + 2;
  }
  if (result->number_of_columns == 1) {
    for (uVar8 = 0; uVar8 < result->null_str_count; uVar8 = uVar8 + 1) {
      if ((result->null_str_size).
          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar8] == 0) {
        pCVar5 = ((result->super_ScannerResult).state_machine)->options;
        if (((pCVar5->force_not_null).super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
             super__Bit_iterator_base._M_p ==
             (pCVar5->force_not_null).super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p) &&
           (*(uint *)((long)&(pCVar5->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) == 0))
        {
          iVar7 = result->number_of_rows;
LAB_00ac8883:
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(*(result->validity_mask).
                        super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                        .
                        super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_TemplatedValidityMask<unsigned_long>,iVar7);
        }
        else {
          cVar6 = vector<bool,_true>::get<true>(&pCVar5->force_not_null,0);
          iVar7 = result->number_of_rows;
          if (!cVar6) goto LAB_00ac8883;
          puVar1 = (undefined8 *)
                   ((long)*(result->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start + iVar7 * 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        result->number_of_rows = result->number_of_rows + 1;
      }
    }
    if ((result->super_ScannerResult).result_size <= (ulong)result->number_of_rows) {
      return true;
    }
  }
  return false;
}

Assistant:

bool StringValueResult::EmptyLine(StringValueResult &result, const idx_t buffer_pos) {
	// We care about empty lines if this is a single column csv file
	result.last_position = {result.iterator.pos.buffer_idx, result.iterator.pos.buffer_pos + 1, result.buffer_size};
	if (result.states.IsCarriageReturn() &&
	    result.state_machine.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		result.last_position.buffer_pos++;
	}
	if (result.number_of_columns == 1) {
		for (idx_t i = 0; i < result.null_str_count; i++) {
			if (result.null_str_size[i] == 0) {
				bool empty = false;
				if (!result.state_machine.options.force_not_null.empty()) {
					empty = result.state_machine.options.force_not_null[0];
				}
				if (empty) {
					static_cast<string_t *>(result.vector_ptr[0])[result.number_of_rows] = string_t();
				} else {
					result.validity_mask[0]->SetInvalid(static_cast<idx_t>(result.number_of_rows));
				}
				result.number_of_rows++;
			}
		}
		if (static_cast<idx_t>(result.number_of_rows) >= result.result_size) {
			// We have a full chunk
			return true;
		}
	}
	return false;
}